

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_dx_iface.c
# Opt level: O0

aom_codec_err_t init_decoder(aom_codec_alg_priv_t *ctx)

{
  long *plVar1;
  int iVar2;
  AVxWorkerInterface *num;
  BufferPool *pBVar3;
  RefCntBuffer *pRVar4;
  AVxWorker *pAVar5;
  void *pvVar6;
  AV1Decoder *pAVar7;
  aom_codec_alg_priv_t *in_RDI;
  FrameWorkerData *frame_worker_data;
  AVxWorker *worker;
  AVxWorkerInterface *winterface;
  void *in_stack_ffffffffffffffe0;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  aom_codec_err_t aVar8;
  
  num = aom_get_worker_interface();
  in_RDI->last_show_frame = (RefCntBuffer *)0x0;
  in_RDI->need_resync = 1;
  in_RDI->flushed = 0;
  pBVar3 = (BufferPool *)aom_calloc((size_t)num,(size_t)in_stack_ffffffffffffffe0);
  in_RDI->buffer_pool = pBVar3;
  if (in_RDI->buffer_pool == (BufferPool *)0x0) {
    aVar8 = AOM_CODEC_MEM_ERROR;
  }
  else {
    in_RDI->buffer_pool->num_frame_bufs = '\x10';
    pRVar4 = (RefCntBuffer *)aom_calloc((size_t)num,(size_t)in_stack_ffffffffffffffe0);
    in_RDI->buffer_pool->frame_bufs = pRVar4;
    if (in_RDI->buffer_pool->frame_bufs == (RefCntBuffer *)0x0) {
      in_RDI->buffer_pool->num_frame_bufs = '\0';
      aom_free(in_stack_ffffffffffffffe0);
      in_RDI->buffer_pool = (BufferPool *)0x0;
      aVar8 = AOM_CODEC_MEM_ERROR;
    }
    else {
      iVar2 = pthread_mutex_init((pthread_mutex_t *)in_RDI->buffer_pool,(pthread_mutexattr_t *)0x0);
      if (iVar2 == 0) {
        pAVar5 = (AVxWorker *)aom_malloc(0x1932d7);
        in_RDI->frame_worker = pAVar5;
        if (in_RDI->frame_worker == (AVxWorker *)0x0) {
          set_error_detail(in_RDI,"Failed to allocate frame_worker");
          aVar8 = AOM_CODEC_MEM_ERROR;
        }
        else {
          pAVar5 = in_RDI->frame_worker;
          (*num->init)(pAVar5);
          pAVar5->thread_name = "aom frameworker";
          pvVar6 = aom_memalign(CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                                (size_t)in_RDI);
          pAVar5->data1 = pvVar6;
          if (pAVar5->data1 == (void *)0x0) {
            (*num->end)(pAVar5);
            aom_free(pAVar5);
            in_RDI->frame_worker = (AVxWorker *)0x0;
            set_error_detail(in_RDI,"Failed to allocate frame_worker_data");
            aVar8 = AOM_CODEC_MEM_ERROR;
          }
          else {
            plVar1 = (long *)pAVar5->data1;
            pAVar7 = av1_decoder_create((BufferPool *)
                                        CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8
                                                ));
            *plVar1 = (long)pAVar7;
            if (*plVar1 == 0) {
              (*num->end)(pAVar5);
              aom_free(pAVar5);
              aom_free(pAVar5);
              in_RDI->frame_worker = (AVxWorker *)0x0;
              set_error_detail(in_RDI,"Failed to allocate frame_worker_data->pbi");
              aVar8 = AOM_CODEC_MEM_ERROR;
            }
            else {
              *(undefined4 *)((long)plVar1 + 0x2c) = 0;
              *(undefined4 *)(plVar1 + 5) = 0;
              *(uint *)(*plVar1 + 0x58d84) = (in_RDI->cfg).allow_lowbitdepth;
              *(uint *)(*plVar1 + 0x58d88) = (in_RDI->cfg).threads;
              *(int *)(*plVar1 + 0x58d8c) = in_RDI->invert_tile_order;
              *(uint *)(*plVar1 + 0x9e44) = in_RDI->tile_mode;
              *(uint *)(*plVar1 + 0x5f72c) = in_RDI->is_annexb;
              *(int *)(*plVar1 + 0x58da0) = in_RDI->decode_tile_row;
              *(int *)(*plVar1 + 0x58da4) = in_RDI->decode_tile_col;
              *(int *)(*plVar1 + 0x58db0) = in_RDI->operating_point;
              *(int *)(*plVar1 + 0x58d50) = in_RDI->output_all_layers;
              *(uint *)(*plVar1 + 0x58df0) = in_RDI->ext_tile_debug;
              *(uint *)(*plVar1 + 0x58df4) = in_RDI->row_mt;
              *(undefined4 *)(*plVar1 + 0x5f750) = 0;
              *(undefined4 *)(*plVar1 + 0x5f754) = 0;
              pAVar5->hook = frame_worker_hook;
              init_buffer_callbacks((aom_codec_alg_priv_t *)frame_worker_data);
              aVar8 = AOM_CODEC_OK;
            }
          }
        }
      }
      else {
        aom_free(in_stack_ffffffffffffffe0);
        in_RDI->buffer_pool->frame_bufs = (RefCntBuffer *)0x0;
        in_RDI->buffer_pool->num_frame_bufs = '\0';
        aom_free(in_stack_ffffffffffffffe0);
        in_RDI->buffer_pool = (BufferPool *)0x0;
        set_error_detail(in_RDI,"Failed to allocate buffer pool mutex");
        aVar8 = AOM_CODEC_MEM_ERROR;
      }
    }
  }
  return aVar8;
}

Assistant:

static aom_codec_err_t init_decoder(aom_codec_alg_priv_t *ctx) {
  const AVxWorkerInterface *const winterface = aom_get_worker_interface();

  ctx->last_show_frame = NULL;
  ctx->need_resync = 1;
  ctx->flushed = 0;

  ctx->buffer_pool = (BufferPool *)aom_calloc(1, sizeof(BufferPool));
  if (ctx->buffer_pool == NULL) return AOM_CODEC_MEM_ERROR;
  ctx->buffer_pool->num_frame_bufs = FRAME_BUFFERS;
  ctx->buffer_pool->frame_bufs = (RefCntBuffer *)aom_calloc(
      ctx->buffer_pool->num_frame_bufs, sizeof(*ctx->buffer_pool->frame_bufs));
  if (ctx->buffer_pool->frame_bufs == NULL) {
    ctx->buffer_pool->num_frame_bufs = 0;
    aom_free(ctx->buffer_pool);
    ctx->buffer_pool = NULL;
    return AOM_CODEC_MEM_ERROR;
  }

#if CONFIG_MULTITHREAD
  if (pthread_mutex_init(&ctx->buffer_pool->pool_mutex, NULL)) {
    aom_free(ctx->buffer_pool->frame_bufs);
    ctx->buffer_pool->frame_bufs = NULL;
    ctx->buffer_pool->num_frame_bufs = 0;
    aom_free(ctx->buffer_pool);
    ctx->buffer_pool = NULL;
    set_error_detail(ctx, "Failed to allocate buffer pool mutex");
    return AOM_CODEC_MEM_ERROR;
  }
#endif

  ctx->frame_worker = (AVxWorker *)aom_malloc(sizeof(*ctx->frame_worker));
  if (ctx->frame_worker == NULL) {
    set_error_detail(ctx, "Failed to allocate frame_worker");
    return AOM_CODEC_MEM_ERROR;
  }

  AVxWorker *const worker = ctx->frame_worker;
  winterface->init(worker);
  worker->thread_name = "aom frameworker";
  worker->data1 = aom_memalign(32, sizeof(FrameWorkerData));
  if (worker->data1 == NULL) {
    winterface->end(worker);
    aom_free(worker);
    ctx->frame_worker = NULL;
    set_error_detail(ctx, "Failed to allocate frame_worker_data");
    return AOM_CODEC_MEM_ERROR;
  }
  FrameWorkerData *frame_worker_data = (FrameWorkerData *)worker->data1;
  frame_worker_data->pbi = av1_decoder_create(ctx->buffer_pool);
  if (frame_worker_data->pbi == NULL) {
    winterface->end(worker);
    aom_free(frame_worker_data);
    aom_free(worker);
    ctx->frame_worker = NULL;
    set_error_detail(ctx, "Failed to allocate frame_worker_data->pbi");
    return AOM_CODEC_MEM_ERROR;
  }
  frame_worker_data->frame_context_ready = 0;
  frame_worker_data->received_frame = 0;
  frame_worker_data->pbi->allow_lowbitdepth = ctx->cfg.allow_lowbitdepth;

  // If decoding in serial mode, FrameWorker thread could create tile worker
  // thread or loopfilter thread.
  frame_worker_data->pbi->max_threads = ctx->cfg.threads;
  frame_worker_data->pbi->inv_tile_order = ctx->invert_tile_order;
  frame_worker_data->pbi->common.tiles.large_scale = ctx->tile_mode;
  frame_worker_data->pbi->is_annexb = ctx->is_annexb;
  frame_worker_data->pbi->dec_tile_row = ctx->decode_tile_row;
  frame_worker_data->pbi->dec_tile_col = ctx->decode_tile_col;
  frame_worker_data->pbi->operating_point = ctx->operating_point;
  frame_worker_data->pbi->output_all_layers = ctx->output_all_layers;
  frame_worker_data->pbi->ext_tile_debug = ctx->ext_tile_debug;
  frame_worker_data->pbi->row_mt = ctx->row_mt;
  frame_worker_data->pbi->is_fwd_kf_present = 0;
  frame_worker_data->pbi->is_arf_frame_present = 0;
  worker->hook = frame_worker_hook;

  init_buffer_callbacks(ctx);

  return AOM_CODEC_OK;
}